

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_split_noMemoryAvailable_fn(int _i)

{
  int iVar1;
  ASplittedString *pAVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  ASplittedString *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x15340a;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,";01;;23;",9);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  uStack_50 = 0x153451;
  pAVar2 = AString_split(&string,';',false);
  if (string.capacity != 8) {
    pcStack_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar6 = "(string).capacity";
    pcVar7 = (char *)string.capacity;
LAB_00153723:
    iVar1 = 0xa4f;
LAB_00153880:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = (ASplittedString *)0x8;
    ppcVar4 = &pcStack_60;
    goto LAB_001538ec;
  }
  uStack_50 = 0x153472;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa4f);
  if (string.buffer == (char *)0x0) {
    iVar1 = 0xa4f;
LAB_001537e9:
    uStack_50 = 0;
    local_58 = (ASplittedString *)0x0;
    pcStack_60 = (char *)0x1537f0;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer");
  }
  uStack_50 = 0x15348f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa4f);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar7 = "";
    pcVar8 = "(null)";
LAB_001536b7:
    iVar1 = 0xa4f;
  }
  else {
    uStack_50 = 0x1534af;
    iVar1 = strcmp(";01;;23;",string.buffer);
    if (iVar1 != 0) {
      pcVar7 = "\"";
      goto LAB_001536b7;
    }
    uStack_50 = 0x1534c8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa4f);
    if (string.size != 8) {
      pcStack_60 = "strlen(\";01;;23;\")";
      pcVar5 = "(string).size == strlen(\";01;;23;\")";
      pcVar6 = "(string).size";
      pcVar7 = (char *)string.size;
      goto LAB_00153723;
    }
    uStack_50 = 0x1534e8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa4f);
    if (pAVar2 != (ASplittedString *)0x0) {
      iVar1 = 0xa50;
LAB_001538ab:
      uStack_50 = 0;
      pcStack_60 = (char *)0x1538b6;
      local_58 = pAVar2;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,"Assertion \'_ck_x == NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) splitted == NULL",
                        "(void*) splitted");
    }
    uStack_50 = 0x153502;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa50);
    if (private_ACUtilsTest_AString_reallocCount != private_ACUtilsTest_AString_freeCount) {
      iVar1 = 0xa51;
LAB_001538e5:
      pcVar6 = "private_ACUtilsTest_AString_reallocCount";
      pcVar5 = "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
      ;
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      local_58 = (ASplittedString *)private_ACUtilsTest_AString_freeCount;
      ppcVar4 = &pcStack_60;
      pcStack_60 = "(private_ACUtilsTest_AString_freeCount)";
      pcVar7 = (char *)private_ACUtilsTest_AString_reallocCount;
      goto LAB_001538ec;
    }
    uStack_50 = 0x15352a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa51);
    private_ACUtilsTest_AString_reallocFailCounter = 2;
    private_ACUtilsTest_AString_reallocFail = 1;
    uStack_50 = 0x15354e;
    pAVar2 = AString_split(&string,';',false);
    if (string.capacity != 8) {
      pcStack_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar6 = "(string).capacity";
      pcVar7 = (char *)string.capacity;
LAB_0015387b:
      iVar1 = 0xa54;
      goto LAB_00153880;
    }
    uStack_50 = 0x153570;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa54);
    if (string.buffer == (char *)0x0) {
      iVar1 = 0xa54;
      goto LAB_001537e9;
    }
    uStack_50 = 0x15358d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa54);
    pcVar8 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar8 = "(null)";
      pcVar7 = "";
    }
    else {
      uStack_50 = 0x1535aa;
      iVar1 = strcmp(";01;;23;",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x1535c3;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa54);
        if (string.size == 8) {
          uStack_50 = 0x1535e3;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa54);
          if (pAVar2 != (ASplittedString *)0x0) {
            iVar1 = 0xa55;
            goto LAB_001538ab;
          }
          uStack_50 = 0x1535fd;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa55);
          if (private_ACUtilsTest_AString_reallocCount == private_ACUtilsTest_AString_freeCount) {
            uStack_50 = 0x153625;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa56);
            uStack_50 = 0x15362e;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          iVar1 = 0xa56;
          goto LAB_001538e5;
        }
        pcStack_60 = "strlen(\";01;;23;\")";
        pcVar5 = "(string).size == strlen(\";01;;23;\")";
        pcVar6 = "(string).size";
        pcVar7 = (char *)string.size;
        goto LAB_0015387b;
      }
      pcVar7 = "\"";
    }
    iVar1 = 0xa54;
  }
  pcVar6 = "(string).buffer";
  pcVar5 = "(string).buffer == (\";01;;23;\")";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = (ASplittedString *)0x15d4c3;
  pcStack_60 = ";01;;23;";
  pcStack_68 = "\"";
  pcStack_70 = "(\";01;;23;\")";
  ppcVar4 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar7;
LAB_001538ec:
  uStack_50 = 0;
  *(char **)((long)ppcVar4 + -8) = pcVar7;
  *(code **)((long)ppcVar4 + -0x10) = test_AString_split_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_split_noMemoryAvailable)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NULL(splitted);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_setReallocFail(true, 2);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NULL(splitted);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}